

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.cpp
# Opt level: O3

void duckdb::PadFunction<duckdb::LeftPadOperator>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined8 *puVar1;
  UnifiedVectorFormat *pUVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined1 (*pauVar4) [16];
  byte bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  UnifiedVectorFormat *pUVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  _Head_base<0UL,_unsigned_long_*,_false> _Var14;
  UnifiedVectorFormat *pUVar15;
  UnifiedVectorFormat *pUVar16;
  undefined8 *puVar17;
  int32_t iVar18;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar19;
  string_t sVar20;
  undefined1 auVar21 [16];
  vector<char,_true> buffer;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  anon_union_16_2_67f50693_for_value local_168;
  long local_158;
  char *local_150;
  char *local_148;
  long *local_140;
  anon_union_16_2_67f50693_for_value local_138;
  vector<char,_true> local_128;
  Vector *local_110;
  anon_union_16_2_67f50693_for_value local_108;
  long local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  anon_union_16_2_67f50693_for_value local_c0;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pvVar9 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  pvVar10 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  pvVar11 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,2);
  local_128.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_128.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_128.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  pUVar2 = *(UnifiedVectorFormat **)(args + 0x18);
  if (((*pvVar9 == (value_type)0x2) && (*pvVar10 == (value_type)0x2)) &&
     (*pvVar11 == (value_type)0x2)) {
    duckdb::Vector::SetVectorType((VectorType)result);
    if ((((*(byte **)(pvVar9 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar9 + 0x28) & 1) != 0)) &&
        ((*(byte **)(pvVar10 + 0x28) == (byte *)0x0 || ((**(byte **)(pvVar10 + 0x28) & 1) != 0))))
       && ((*(byte **)(pvVar11 + 0x28) == (byte *)0x0 || ((**(byte **)(pvVar11 + 0x28) & 1) != 0))))
    {
      pauVar4 = *(undefined1 (**) [16])(result + 0x20);
      local_c0._0_8_ = **(undefined8 **)(pvVar9 + 0x20);
      local_c0.pointer.ptr = (char *)(*(undefined8 **)(pvVar9 + 0x20))[1];
      local_108._0_8_ = **(undefined8 **)(pvVar11 + 0x20);
      local_108.pointer.ptr = (char *)(*(undefined8 **)(pvVar11 + 0x20))[1];
      iVar18 = 0;
      if (0 < **(int **)(pvVar10 + 0x20)) {
        iVar18 = **(int **)(pvVar10 + 0x20);
      }
      sVar20 = LeftPadOperator::Operation
                         ((string_t *)&local_c0.pointer,iVar18,(string_t *)&local_108.pointer,
                          &local_128);
      auVar21 = duckdb::StringVector::AddString(result,sVar20);
      *pauVar4 = auVar21;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0.pointer);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_108.pointer);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar9,pUVar2);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar10,pUVar2);
    duckdb::Vector::ToUnifiedFormat((ulong)pvVar11,pUVar2);
    uVar8 = local_108._0_8_;
    local_140 = (long *)local_c0._0_8_;
    local_148 = local_c0.pointer.ptr;
    local_150 = local_108.pointer.ptr;
    local_158 = local_70;
    lVar3 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    if (((local_b0 == 0) && (local_f8 == 0)) && (local_68 == 0)) {
      if (pUVar2 != (UnifiedVectorFormat *)0x0) {
        puVar17 = (undefined8 *)(lVar3 + 8);
        pUVar19 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar12 = pUVar19;
          if (*local_140 != 0) {
            pUVar12 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_140 + (long)pUVar19 * 4);
          }
          lVar3 = *(long *)uVar8;
          pUVar15 = pUVar19;
          if (lVar3 != 0) {
            pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar3 + (long)pUVar19 * 4);
          }
          pUVar16 = pUVar19;
          if (*local_78 != 0) {
            pUVar16 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_78 + (long)pUVar19 * 4);
          }
          local_168._0_8_ = *(undefined8 *)(local_148 + (long)pUVar12 * 0x10);
          local_168.pointer.ptr = (char *)*(undefined8 *)(local_148 + (long)pUVar12 * 0x10 + 8);
          puVar1 = (undefined8 *)(local_158 + (long)pUVar16 * 0x10);
          local_138._0_8_ = *puVar1;
          local_138.pointer.ptr = (char *)puVar1[1];
          iVar18 = *(int *)(local_150 + (long)pUVar15 * 4);
          if (*(int *)(local_150 + (long)pUVar15 * 4) < 1) {
            iVar18 = 0;
          }
          sVar20 = LeftPadOperator::Operation
                             ((string_t *)&local_168.pointer,iVar18,(string_t *)&local_138.pointer,
                              &local_128);
          auVar21 = duckdb::StringVector::AddString(result,sVar20);
          puVar17[-1] = auVar21._0_8_;
          *puVar17 = auVar21._8_8_;
          pUVar19 = pUVar19 + 1;
          puVar17 = puVar17 + 2;
        } while (pUVar2 != pUVar19);
      }
    }
    else if (pUVar2 != (UnifiedVectorFormat *)0x0) {
      local_110 = result + 0x30;
      puVar17 = (undefined8 *)(lVar3 + 8);
      pUVar19 = (UnifiedVectorFormat *)0x0;
      do {
        pUVar12 = pUVar19;
        if (*local_140 != 0) {
          pUVar12 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_140 + (long)pUVar19 * 4);
        }
        lVar3 = *(long *)uVar8;
        pUVar15 = pUVar19;
        if (lVar3 != 0) {
          pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar3 + (long)pUVar19 * 4);
        }
        pUVar16 = pUVar19;
        if (*local_78 != 0) {
          pUVar16 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_78 + (long)pUVar19 * 4);
        }
        if (((local_b0 == 0) ||
            ((*(ulong *)(local_b0 + ((ulong)pUVar12 >> 6) * 8) >> ((ulong)pUVar12 & 0x3f) & 1) != 0)
            ) && (((local_f8 == 0 ||
                   ((*(ulong *)(local_f8 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1
                    ) != 0)) &&
                  ((local_68 == 0 ||
                   ((*(ulong *)(local_68 + ((ulong)pUVar16 >> 6) * 8) >> ((ulong)pUVar16 & 0x3f) & 1
                    ) != 0)))))) {
          local_168._0_8_ = *(undefined8 *)(local_148 + (long)pUVar12 * 0x10);
          local_168.pointer.ptr = (char *)*(undefined8 *)(local_148 + (long)pUVar12 * 0x10 + 8);
          puVar1 = (undefined8 *)(local_158 + (long)pUVar16 * 0x10);
          local_138._0_8_ = *puVar1;
          local_138.pointer.ptr = (char *)puVar1[1];
          iVar18 = *(int *)(local_150 + (long)pUVar15 * 4);
          if (*(int *)(local_150 + (long)pUVar15 * 4) < 1) {
            iVar18 = 0;
          }
          sVar20 = LeftPadOperator::Operation
                             ((string_t *)&local_168.pointer,iVar18,(string_t *)&local_138.pointer,
                              &local_128);
          auVar21 = duckdb::StringVector::AddString(result,sVar20);
          puVar17[-1] = auVar21._0_8_;
          *puVar17 = auVar21._8_8_;
        }
        else {
          _Var14._M_head_impl = *(unsigned_long **)(result + 0x28);
          if (_Var14._M_head_impl == (unsigned_long *)0x0) {
            local_138._0_8_ = *(undefined8 *)(result + 0x40);
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_168.pointer,(unsigned_long *)&local_138);
            uVar7 = local_168.pointer.ptr;
            uVar6 = local_168._0_8_;
            local_168._0_8_ = 0;
            local_168.pointer.ptr = (char *)0x0;
            this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
            *(undefined8 *)(result + 0x30) = uVar6;
            *(undefined8 *)(result + 0x38) = uVar7;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.pointer.ptr !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.pointer.ptr);
            }
            pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 local_110);
            _Var14._M_head_impl =
                 (pTVar13->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(unsigned_long **)(result + 0x28) = _Var14._M_head_impl;
          }
          bVar5 = (byte)pUVar19 & 0x3f;
          _Var14._M_head_impl[(ulong)pUVar19 >> 6] =
               _Var14._M_head_impl[(ulong)pUVar19 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        pUVar19 = pUVar19 + 1;
        puVar17 = puVar17 + 2;
      } while (pUVar2 != pUVar19);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
    }
    if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
  }
  if (local_128.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_128.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start);
  }
  return;
}

Assistant:

static void PadFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vector = args.data[0];
	auto &len_vector = args.data[1];
	auto &pad_vector = args.data[2];

	vector<char> buffer;
	TernaryExecutor::Execute<string_t, int32_t, string_t, string_t>(
	    str_vector, len_vector, pad_vector, result, args.size(), [&](string_t str, int32_t len, string_t pad) {
		    len = MaxValue<int32_t>(len, 0);
		    return StringVector::AddString(result, OP::Operation(str, len, pad, buffer));
	    });
}